

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O3

Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> * __thiscall
MapLoader::loadMap_abi_cxx11_(MapLoader *this)

{
  bool bVar1;
  int iVar2;
  istream *piVar3;
  long *plVar4;
  long lVar5;
  char *pcVar6;
  ostream *poVar7;
  undefined8 uVar8;
  size_type *psVar9;
  string newNeighbor;
  string nodeName;
  string nodeType;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ifstream input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_308
  ;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  ulong local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  istream local_238 [520];
  
  do {
    bVar1 = fileIsValid(this);
  } while (!bVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Setting up the game board...",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  local_308 = (Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)operator_new(0x18);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Graph
            (local_308,this->nodeCount);
  std::ifstream::ifstream(local_238);
  std::ifstream::open((char *)local_238,(_Ios_Openmode)(this->filePath)._M_dataplus._M_p);
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"");
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"");
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"");
  local_2c0 = 0;
  do {
    do {
      piVar3 = std::operator>>(local_238,(string *)&local_2e0);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Graph --------------------------------",0x26);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
        std::ostream::put(-0x30);
        std::ostream::flush();
        Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        toString(&local_348,local_308);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_348._M_dataplus._M_p,
                            local_348._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
        }
        this->map = local_308;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        std::ifstream::~ifstream(local_238);
        return this->map;
      }
      iVar2 = std::__cxx11::string::compare((char *)&local_2e0);
    } while (iVar2 != 0);
    std::__cxx11::string::_M_replace
              ((ulong)&local_328,0,(char *)local_328._M_string_length,0x11d487);
    std::__cxx11::string::_M_replace
              ((ulong)&local_300,0,(char *)local_300._M_string_length,0x11d487);
    std::operator>>(local_238,(string *)&local_2e0);
    std::operator>>(local_238,(string *)&local_2e0);
    while( true ) {
      piVar3 = std::operator>>(local_238,(string *)&local_2e0);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      iVar2 = std::__cxx11::string::compare((char *)&local_2e0);
      if (iVar2 == 0) break;
      std::operator+(&local_2b8,&local_328,&local_2e0);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_2b8);
      psVar9 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_348.field_2._M_allocated_capacity = *psVar9;
        local_348.field_2._8_8_ = plVar4[3];
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      }
      else {
        local_348.field_2._M_allocated_capacity = *psVar9;
        local_348._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_348._M_string_length = plVar4[1];
      *plVar4 = (long)psVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_328,(string *)&local_348);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
    }
LAB_00115cb4:
    piVar3 = std::operator>>(local_238,(string *)&local_2e0);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
      iVar2 = std::__cxx11::string::compare((char *)&local_2e0);
      if (iVar2 == 0) goto LAB_00115ce0;
      std::operator+(&local_348,&local_300,&local_2e0);
      std::__cxx11::string::operator=((string *)&local_300,(string *)&local_348);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00115cb4;
    }
LAB_00115ce0:
    lVar5 = std::__cxx11::string::find_last_not_of((char *)&local_328,0x11d483,0xffffffffffffffff);
    pcVar6 = (char *)(lVar5 + 1);
    if (local_328._M_string_length < pcVar6) {
LAB_00116207:
      uVar8 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                         "basic_string::erase",pcVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
      }
      std::ifstream::~ifstream(local_238);
      _Unwind_Resume(uVar8);
    }
    local_328._M_dataplus._M_p[(long)pcVar6] = '\0';
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    local_328._M_string_length = (size_type)pcVar6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,local_328._M_dataplus._M_p,
               pcVar6 + (long)local_328._M_dataplus._M_p);
    Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    setVertexName(local_308,&local_258,(int)local_2c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"adding vertex name",0x12);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_328._M_dataplus._M_p,local_328._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_278,local_300._M_dataplus._M_p,
               (char *)(local_300._M_string_length + (long)local_300._M_dataplus._M_p));
    Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    setVertexData(local_308,&local_278,(int)local_2c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"adding vertex data",0x12);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_300._M_dataplus._M_p,local_300._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"");
    while( true ) {
      piVar3 = std::operator>>(local_238,(string *)&local_2e0);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      iVar2 = std::__cxx11::string::compare((char *)&local_2e0);
      if (iVar2 == 0) break;
      iVar2 = std::__cxx11::string::compare((char *)&local_2e0);
      if (iVar2 == 0) {
        lVar5 = std::__cxx11::string::find_last_not_of
                          ((char *)&local_348,0x11d483,0xffffffffffffffff);
        pcVar6 = (char *)(lVar5 + 1);
        if (local_348._M_string_length < pcVar6) {
          pcVar6 = (char *)std::__throw_out_of_range_fmt
                                     ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                                      "basic_string::erase",pcVar6);
          goto LAB_00116207;
        }
        local_348._M_dataplus._M_p[(long)pcVar6] = '\0';
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        local_348._M_string_length = (size_type)pcVar6;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_348._M_dataplus._M_p,
                   pcVar6 + (long)local_348._M_dataplus._M_p);
        Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        addNeighbor(local_308,&local_298,(int)local_2c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"adding neighbor",0xf);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_348._M_dataplus._M_p,
                            local_348._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        std::__cxx11::string::_M_replace
                  ((ulong)&local_348,0,(char *)local_348._M_string_length,0x11d487);
      }
      else {
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2b8,local_2e0._M_dataplus._M_p,
                   local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
        std::__cxx11::string::append((char *)&local_2b8);
        std::__cxx11::string::_M_append((char *)&local_348,(ulong)local_2b8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    local_2c0 = (ulong)((int)local_2c0 + 1);
  } while( true );
}

Assistant:

Graph<string>* MapLoader::loadMap()
{
  //method to load the map file into a graph object

  bool result = false;

  while(!result)
  {

    if(fileIsValid())
    {
      //if the file was valid then we set up the graph object by reading all of the data in the file and assigning nodes
      cout << "Setting up the game board..." << endl;

      Graph<string>* graph = new Graph<string>(nodeCount);

      //we need to reopen the file

      ifstream input; //the input stream associated to out file
      input.open(filePath.c_str()); //try opening the file

      //we already know it is valid so we can start reading right away
      string line = "";
      string nodeName = "";
      string nodeType = "";
      int graphIndex = 0;

      //while we still have readable lines
      while(input >> line)
      {
        //first get the name of the node
        if(line == "@node")
        {
          //wipe the nodeName and nodeType clean
          nodeName = "";
          nodeType = "";

          //if the line is the node declaration
          //then go to the next line and the line after that, where the name field is
          input >> line;
          input >> line;

          //now that we are at the name field we read until we hit adjacent node
          while(input >> line && line != "type:")
          {
            nodeName = nodeName + line + " ";
          }

          //now we need to get the type of node that it is
          while(input >> line && line != "adjacent:")
          {
            nodeType = nodeType + line;
          }

          //since we add a space at the end, we need to trim the right side
          nodeName.erase(nodeName.find_last_not_of(" \n\r\t")+1);
          //now that we have the name of the node, we need to add it to our graph
          graph -> setVertexName(nodeName, graphIndex);
          cout << "adding vertex name" << nodeName << endl;
          graph -> setVertexData(nodeType, graphIndex);
          cout << "adding vertex data" << nodeType << endl;

          //now that we have added the name of the node we need to add every node it is adjacent to to its adjacency list

          string newNeighbor = ""; //the string that will hold the name of the new neighbor to the node

          //while we have not reached a closing brace, keep reading
          while(input >> line && line != "}")
          {
            //if the line contains the word adjacent, then skip that word
            if(line == "adjacent:")
            {
              newNeighbor.erase(newNeighbor.find_last_not_of(" \n\r\t")+1);
              graph -> addNeighbor(newNeighbor, graphIndex); //add the new neighbor
              cout << "adding neighbor" << newNeighbor << endl;
              newNeighbor = ""; //wipe the newNeighbor field and then continue the iteration
              continue;
            }

            else
            {
              newNeighbor += line + " ";
            }
          }

          graphIndex++;
        }
      }
      cout << "Graph --------------------------------" << endl;
      cout << graph->toString() << endl;
      map = graph;
      result = true;
    }

    else
    {
      //if the file was not valid then we need to try again
      result = false;
    }
  }

  return map;

}